

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *old)

{
  undefined8 *puVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  Data *pDVar4;
  undefined8 uVar5;
  qsizetype qVar6;
  bool bVar7;
  QDnsCachedName *pQVar8;
  QDnsCachedName *pQVar9;
  QDnsCachedName *pQVar10;
  long lVar11;
  Int IVar12;
  long lVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  QArrayData *d;
  QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> local_48;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (where == GrowsAtEnd) {
    pQVar3 = &this->d->super_QArrayData;
    if (pQVar3 == (QArrayData *)0x0) {
      bVar7 = true;
    }
    else {
      bVar7 = 1 < (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar7)) {
      if (pQVar3 == (QArrayData *)0x0) {
        lVar11 = 1;
        lVar13 = 0;
      }
      else {
        lVar11 = pQVar3->alloc + 1;
        lVar13 = (this->size - pQVar3->alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pQVar3[1].alloc + 7U) & 0xfffffffffffffff0)) >> 5);
      }
      auVar14 = QArrayData::reallocateUnaligned(pQVar3,this->ptr,0x20,lVar11 + lVar13,Grow);
      this->d = (Data *)auVar14._0_8_;
      this->ptr = (QDnsCachedName *)auVar14._8_8_;
      goto LAB_00237603;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QDnsCachedName *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar2 = this->d;
  if (pDVar2 == (Data *)0x0) {
    lVar11 = 0;
  }
  else {
    lVar11 = (pDVar2->super_QArrayData).alloc;
  }
  lVar13 = this->size;
  if (lVar11 < lVar13) {
    lVar11 = lVar13;
  }
  if (where == GrowsAtEnd) {
    if (pDVar2 == (Data *)0x0) goto LAB_002373eb;
    lVar13 = (pDVar2->super_QArrayData).alloc -
             (lVar13 + ((long)((long)this->ptr -
                              ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) &
                              0xfffffffffffffff0)) >> 5));
  }
  else if (pDVar2 == (Data *)0x0) {
LAB_002373eb:
    lVar13 = 0;
  }
  else {
    lVar13 = (long)((long)this->ptr -
                   ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             5;
  }
  lVar13 = (lVar11 + n) - lVar13;
  if (pDVar2 != (Data *)0x0) {
    lVar11 = (pDVar2->super_QArrayData).alloc;
    if (lVar11 <= lVar13) {
      lVar11 = lVar13;
    }
    if (((pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
      lVar13 = lVar11;
    }
  }
  if (pDVar2 == (Data *)0x0) {
    lVar11 = 0;
  }
  else {
    lVar11 = (pDVar2->super_QArrayData).alloc;
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar8 = (QDnsCachedName *)
           QArrayData::allocate(&local_30,0x20,0x10,lVar13,(uint)(lVar13 <= lVar11));
  if (pQVar8 != (QDnsCachedName *)0x0 && local_30 != (QArrayData *)0x0) {
    if (where == GrowsAtBeginning) {
      lVar13 = (local_30->alloc - (this->size + n)) / 2;
      lVar11 = 0;
      if (0 < lVar13) {
        lVar11 = lVar13;
      }
      lVar11 = lVar11 + n;
    }
    else if (this->d == (Data *)0x0) {
      lVar11 = 0;
    }
    else {
      lVar11 = (long)((long)this->ptr -
                     ((ulong)((long)&this->d[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 5;
    }
    if (this->d == (Data *)0x0) {
      IVar12 = 0;
    }
    else {
      IVar12 = (this->d->super_QArrayData).flags.
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
    pQVar8 = pQVar8 + lVar11;
    (local_30->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar12;
  }
  local_48.size = 0;
  lVar11 = this->size;
  if (lVar11 != 0) {
    if ((this->d == (Data *)0x0) ||
       (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      if (0 < lVar11) {
        pQVar10 = this->ptr;
        pQVar9 = pQVar10 + lVar11;
        do {
          pDVar4 = (pQVar10->name).d.d;
          pQVar8[local_48.size].name.d.d = pDVar4;
          pQVar8[local_48.size].name.d.ptr = (pQVar10->name).d.ptr;
          pQVar8[local_48.size].name.d.size = (pQVar10->name).d.size;
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1)
            ;
            UNLOCK();
          }
          pQVar8[local_48.size].code = pQVar10->code;
          pQVar10 = pQVar10 + 1;
          local_48.size = local_48.size + 1;
        } while (pQVar10 < pQVar9);
      }
    }
    else if (0 < lVar11) {
      pQVar10 = this->ptr;
      local_48.size = 0;
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(pQVar10->name).d.d + lVar13);
        uVar5 = *puVar1;
        *puVar1 = 0;
        *(undefined8 *)((long)&(pQVar8->name).d.d + lVar13) = uVar5;
        uVar5 = puVar1[1];
        puVar1[1] = 0;
        *(undefined8 *)((long)&(pQVar8->name).d.ptr + lVar13) = uVar5;
        uVar5 = puVar1[2];
        puVar1[2] = 0;
        *(undefined8 *)((long)&(pQVar8->name).d.size + lVar13) = uVar5;
        *(undefined4 *)((long)&pQVar8->code + lVar13) = *(undefined4 *)(puVar1 + 3);
        local_48.size = local_48.size + 1;
        lVar13 = lVar13 + 0x20;
      } while ((QDnsCachedName *)(puVar1 + 4) < pQVar10 + lVar11);
    }
  }
  local_48.d = this->d;
  local_48.ptr = this->ptr;
  this->d = (Data *)local_30;
  this->ptr = pQVar8;
  qVar6 = this->size;
  this->size = local_48.size;
  local_48.size = qVar6;
  ~QArrayDataPointer(&local_48);
LAB_00237603:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }